

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,StringRef _className,NameAndTags *_nameAndTags,
          SourceLineInfo *_lineInfo)

{
  ulong uVar1;
  anon_unknown_26 *this_00;
  size_t sVar2;
  bool bVar3;
  char cVar4;
  TestCaseProperties TVar5;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  ostream *poVar9;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_> __first;
  ReusableStringStream *pRVar10;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type sVar11;
  ulong uVar12;
  ulong index;
  bool bVar13;
  StringRef filename;
  StringRef tag;
  StringRef tag_00;
  StringRef tagStr;
  StringRef tagStr_00;
  ReusableStringStream local_d8;
  StringRef local_c8;
  NameAndTags *local_b8;
  string local_b0;
  SourceLineInfo *local_90;
  StringRef originalTags;
  ReusableStringStream local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar11 = (_nameAndTags->name).m_size;
  local_b8 = _nameAndTags;
  if (sVar11 == 0) {
    (anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter =
         (anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter + 1;
    std::__cxx11::to_string(&local_b0,(anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter);
    std::operator+(&local_50,"Anonymous test case ",&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    local_50._M_dataplus._M_p._0_4_ = *(undefined4 *)&(_nameAndTags->name).m_start;
    local_50._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&(_nameAndTags->name).m_start + 4);
    local_50._M_string_length._0_4_ = (undefined4)(_nameAndTags->name).m_size;
    local_50._M_string_length._4_4_ = *(undefined4 *)((long)&(_nameAndTags->name).m_size + 4);
  }
  local_d8.m_index = CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_);
  local_d8.m_oss =
       (ostream *)CONCAT44(local_50._M_string_length._4_4_,(undefined4)local_50._M_string_length);
  StringRef::operator_cast_to_string(&this->name,(StringRef *)&local_d8);
  if (sVar11 == 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  (this->className).m_start = _className.m_start;
  (this->className).m_size = _className.m_size;
  (this->backingTags)._M_dataplus._M_p = (pointer)&(this->backingTags).field_2;
  (this->backingTags)._M_string_length = 0;
  (this->backingTags).field_2._M_local_buf[0] = '\0';
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar2 = _lineInfo->line;
  (this->lineInfo).file = _lineInfo->file;
  (this->lineInfo).line = sVar2;
  this->properties = None;
  originalTags.m_start = (local_b8->tags).m_start;
  originalTags.m_size = (local_b8->tags).m_size;
  this_00 = (anon_unknown_26 *)_lineInfo->file;
  local_90 = _lineInfo;
  pcVar8 = (char *)strlen((char *)this_00);
  filename.m_size = extraout_RDX;
  filename.m_start = pcVar8;
  anon_unknown_26::extractFilenamePart(this_00,filename);
  std::__cxx11::string::reserve((ulong)&this->backingTags);
  index = 0;
  bVar13 = false;
  uVar12 = 0;
  do {
    if (originalTags.m_size <= index) {
      if (bVar13) {
        ReusableStringStream::ReusableStringStream(&local_d8);
        std::operator<<(local_d8.m_oss,"Found an unclosed tag while registering test case \'");
        pRVar10 = ReusableStringStream::operator<<(&local_d8,&local_b8->name);
        pRVar10 = ReusableStringStream::operator<<(pRVar10,(char (*) [6])"\' at ");
        pRVar10 = ReusableStringStream::operator<<(pRVar10,local_90);
        ReusableStringStream::str_abi_cxx11_(&local_b0,pRVar10);
        throw_domain_error(&local_b0);
      }
      if ((this->properties & IsHidden) != None) {
        tagStr_00.m_size = 1;
        tagStr_00.m_start = ".";
        internalAppendTag(this,tagStr_00);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          ((this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
      std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::erase
                (&this->tags,(const_iterator)__first._M_current,
                 (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      return;
    }
    cVar4 = StringRef::operator[](&originalTags,index);
    if (cVar4 == ']') {
      if (!bVar13) {
        ReusableStringStream::ReusableStringStream(&local_d8);
        std::operator<<(local_d8.m_oss,"Found unmatched \']\' while registering test case \'");
        pRVar10 = ReusableStringStream::operator<<(&local_d8,&local_b8->name);
        pRVar10 = ReusableStringStream::operator<<(pRVar10,(char (*) [6])"\' at ");
        pRVar10 = ReusableStringStream::operator<<(pRVar10,local_90);
        ReusableStringStream::str_abi_cxx11_(&local_b0,pRVar10);
        throw_domain_error(&local_b0);
      }
      if (index <= uVar12) {
        __assert_fail("tagStart < tagEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.cpp"
                      ,0x5f0,
                      "Catch::TestCaseInfo::TestCaseInfo(StringRef, const NameAndTags &, const SourceLineInfo &)"
                     );
      }
      uVar1 = uVar12 + 1;
      poVar9 = (ostream *)(originalTags.m_size - uVar1);
      if (originalTags.m_size < uVar1 || poVar9 == (ostream *)0x0) {
        local_c8.m_start = "";
        local_c8.m_size = 0;
LAB_00120e04:
        ReusableStringStream::ReusableStringStream(&local_d8);
        std::operator<<(local_d8.m_oss,"Found an empty tag while registering test case \'");
        pRVar10 = ReusableStringStream::operator<<(&local_d8,&local_b8->name);
        pRVar10 = ReusableStringStream::operator<<(pRVar10,(char (*) [6])"\' at ");
        pRVar10 = ReusableStringStream::operator<<(pRVar10,local_90);
        ReusableStringStream::str_abi_cxx11_(&local_b0,pRVar10);
        throw_domain_error(&local_b0);
      }
      local_c8.m_start = originalTags.m_start + uVar1;
      local_c8.m_size = (size_type)(~uVar12 + index);
      if (poVar9 < (ostream *)(~uVar12 + index)) {
        local_c8.m_size = (size_type)poVar9;
      }
      if ((ostream *)local_c8.m_size == (ostream *)0x0) goto LAB_00120e04;
      tag.m_size = extraout_RDX_00;
      tag.m_start = (char *)local_c8.m_size;
      local_d8.m_index = (size_t)local_c8.m_start;
      local_d8.m_oss = (ostream *)local_c8.m_size;
      local_b0._M_dataplus._M_p = local_c8.m_start;
      local_b0._M_string_length = local_c8.m_size;
      TVar5 = anon_unknown_26::parseSpecialTag((anon_unknown_26 *)local_c8.m_start,tag);
      sVar11 = extraout_RDX_01;
      if (TVar5 == None) {
        bVar6 = StringRef::operator[]((StringRef *)&local_b0,0);
        iVar7 = isalnum((uint)bVar6);
        sVar11 = extraout_RDX_02;
        if (iVar7 == 0) {
          ReusableStringStream::ReusableStringStream(&local_60);
          std::operator<<(local_60.m_oss,"Tag name: [");
          pRVar10 = ReusableStringStream::operator<<(&local_60,(StringRef *)&local_d8);
          pRVar10 = ReusableStringStream::operator<<(pRVar10,(char (*) [19])"] is not allowed.\n");
          pRVar10 = ReusableStringStream::operator<<
                              (pRVar10,(char (*) [66])
                                       "Tag names starting with non alphanumeric characters are reserved\n"
                              );
          pRVar10 = ReusableStringStream::operator<<(pRVar10,&this->lineInfo);
          ReusableStringStream::str_abi_cxx11_(&local_b0,pRVar10);
          throw_domain_error(&local_b0);
        }
      }
      tag_00.m_size = sVar11;
      tag_00.m_start = (char *)local_c8.m_size;
      TVar5 = anon_unknown_26::parseSpecialTag((anon_unknown_26 *)local_c8.m_start,tag_00);
      this->properties = this->properties | TVar5;
      if (((ostream *)0x1 < local_c8.m_size) &&
         (cVar4 = StringRef::operator[](&local_c8,0), cVar4 == '.')) {
        local_c8.m_start = local_c8.m_start + 1;
        if (local_c8.m_size < (ostream *)0x2) {
          local_c8.m_start = "";
        }
        bVar13 = (ostream *)local_c8.m_size == (ostream *)0x0;
        local_c8.m_size = local_c8.m_size + -1;
        if (bVar13) {
          local_c8.m_size = 0;
        }
      }
      tagStr.m_size = local_c8.m_size;
      tagStr.m_start = local_c8.m_start;
      internalAppendTag(this,tagStr);
      bVar3 = false;
    }
    else {
      bVar3 = bVar13;
      if ((cVar4 == '[') && (uVar12 = index, bVar3 = true, bVar13)) {
        ReusableStringStream::ReusableStringStream(&local_d8);
        std::operator<<(local_d8.m_oss,"Found \'[\' inside a tag while registering test case \'");
        pRVar10 = ReusableStringStream::operator<<(&local_d8,&local_b8->name);
        pRVar10 = ReusableStringStream::operator<<(pRVar10,(char (*) [6])"\' at ");
        pRVar10 = ReusableStringStream::operator<<(pRVar10,local_90);
        ReusableStringStream::str_abi_cxx11_(&local_b0,pRVar10);
        throw_domain_error(&local_b0);
      }
    }
    bVar13 = bVar3;
    index = index + 1;
  } while( true );
}

Assistant:

TestCaseInfo::TestCaseInfo(StringRef _className,
                               NameAndTags const& _nameAndTags,
                               SourceLineInfo const& _lineInfo):
        name( _nameAndTags.name.empty() ? makeDefaultName() : _nameAndTags.name ),
        className( _className ),
        lineInfo( _lineInfo )
    {
        StringRef originalTags = _nameAndTags.tags;
        // We need to reserve enough space to store all of the tags
        // (including optional hidden tag and filename tag)
        auto requiredSize = originalTags.size() + sizeOfExtraTags(_lineInfo.file);
        backingTags.reserve(requiredSize);

        // We cannot copy the tags directly, as we need to normalize
        // some tags, so that [.foo] is copied as [.][foo].
        size_t tagStart = 0;
        size_t tagEnd = 0;
        bool inTag = false;
        for (size_t idx = 0; idx < originalTags.size(); ++idx) {
            auto c = originalTags[idx];
            if (c == '[') {
                CATCH_ENFORCE(
                    !inTag,
                    "Found '[' inside a tag while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = true;
                tagStart = idx;
            }
            if (c == ']') {
                CATCH_ENFORCE(
                    inTag,
                    "Found unmatched ']' while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = false;
                tagEnd = idx;
                assert(tagStart < tagEnd);

                // We need to check the tag for special meanings, copy
                // it over to backing storage and actually reference the
                // backing storage in the saved tags
                StringRef tagStr = originalTags.substr(tagStart+1, tagEnd - tagStart - 1);
                CATCH_ENFORCE( !tagStr.empty(),
                               "Found an empty tag while registering test case '"
                                   << _nameAndTags.name << "' at "
                                   << _lineInfo );

                enforceNotReservedTag(tagStr, lineInfo);
                properties |= parseSpecialTag(tagStr);
                // When copying a tag to the backing storage, we need to
                // check if it is a merged hide tag, such as [.foo], and
                // if it is, we need to handle it as if it was [foo].
                if (tagStr.size() > 1 && tagStr[0] == '.') {
                    tagStr = tagStr.substr(1, tagStr.size() - 1);
                }
                // We skip over dealing with the [.] tag, as we will add
                // it later unconditionally and then sort and unique all
                // the tags.
                internalAppendTag(tagStr);
            }
        }
        CATCH_ENFORCE( !inTag,
                       "Found an unclosed tag while registering test case '"
                           << _nameAndTags.name << "' at " << _lineInfo );


        // Add [.] if relevant
        if (isHidden()) {
            internalAppendTag("."_sr);
        }

        // Sort and prepare tags
        std::sort(begin(tags), end(tags));
        tags.erase(std::unique(begin(tags), end(tags)),
                   end(tags));
    }